

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_skip_orphan_replace(REF_GRID ref_grid,REF_BOOL *replace,REF_INT ldim)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT node;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_INT i;
  REF_INT *contributions;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_BOOL *pRStack_20;
  REF_INT ldim_local;
  REF_BOOL *replace_local;
  REF_GRID ref_grid_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node._4_4_ = ldim;
  pRStack_20 = replace;
  replace_local = (REF_BOOL *)ref_grid;
  if (((REF_NODE)ref_edge)->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x56b,
           "ref_recon_skip_orphan_replace","malloc contributions of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)(((REF_NODE)ref_edge)->max * 6) << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x56b
             ,"ref_recon_skip_orphan_replace","malloc contributions of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0;
          SBORROW4(ref_private_macro_code_rss_1,ref_edge->max * 6) !=
          ref_private_macro_code_rss_1 + ref_edge->max * -6 < 0;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar3 = ref_edge_create((REF_EDGE *)&contributions,(REF_GRID)replace_local);
      if (uVar3 == 0) {
        for (node1 = 0; node1 < *contributions; node1 = node1 + 1) {
          iVar1 = *(int *)(*(long *)(contributions + 2) + (long)(node1 << 1) * 4);
          iVar2 = *(int *)(*(long *)(contributions + 2) + (long)(node1 * 2 + 1) * 4);
          for (node0 = 0; node0 < ref_node._4_4_; node0 = node0 + 1) {
            if ((pRStack_20[node0 + ref_node._4_4_ * iVar1] != 0) &&
               (pRStack_20[node0 + ref_node._4_4_ * iVar2] == 0)) {
              lVar4 = (long)(node0 + ref_node._4_4_ * iVar1);
              *(int *)((long)__ptr + lVar4 * 4) = *(int *)((long)__ptr + lVar4 * 4) + 1;
            }
            if ((pRStack_20[node0 + ref_node._4_4_ * iVar2] != 0) &&
               (pRStack_20[node0 + ref_node._4_4_ * iVar1] == 0)) {
              lVar4 = (long)(node0 + ref_node._4_4_ * iVar2);
              *(int *)((long)__ptr + lVar4 * 4) = *(int *)((long)__ptr + lVar4 * 4) + 1;
            }
          }
        }
        uVar3 = ref_edge_free((REF_EDGE)contributions);
        if (uVar3 == 0) {
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_edge->max;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < ref_edge->max))
               && (-1 < *(long *)(&ref_edge->adj->nnode + (long)ref_private_macro_code_rss * 2))) {
              for (node0 = 0; node0 < ref_node._4_4_; node0 = node0 + 1) {
                if (*(int *)((long)__ptr +
                            (long)(node0 + ref_node._4_4_ * ref_private_macro_code_rss) * 4) == 0) {
                  pRStack_20[node0 + ref_node._4_4_ * ref_private_macro_code_rss] = 0;
                }
              }
            }
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x579,"ref_recon_skip_orphan_replace",(ulong)uVar3,"free edge");
          ref_grid_local._4_4_ = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x56c,"ref_recon_skip_orphan_replace",(ulong)uVar3,"edges");
        ref_grid_local._4_4_ = uVar3;
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_skip_orphan_replace(REF_GRID ref_grid,
                                                        REF_BOOL *replace,
                                                        REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT *contributions;
  REF_INT i, edge, node0, node1, node;
  ref_malloc_init(contributions, 6 * ref_node_max(ref_node), REF_INT, 0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    for (i = 0; i < ldim; i++) {
      if (replace[i + ldim * node0]) {
        if (!replace[i + ldim * node1]) contributions[i + ldim * node0]++;
      }
      if (replace[i + ldim * node1]) {
        if (!replace[i + ldim * node0]) contributions[i + ldim * node1]++;
      }
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      if (0 == contributions[i + ldim * node])
        replace[i + ldim * node] = REF_FALSE;
    }
  }
  ref_free(contributions);
  return REF_SUCCESS;
}